

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQClosure::SetRoot(SQClosure *this,SQWeakRef *r)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x38) != 0) {
    *(long *)(*(long *)(in_RDI + 0x38) + 8) = *(long *)(*(long *)(in_RDI + 0x38) + 8) + -1;
    if (*(long *)(*(long *)(in_RDI + 0x38) + 8) == 0) {
      (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))();
    }
    *(undefined8 *)(in_RDI + 0x38) = 0;
  }
  *(undefined8 *)(in_RDI + 0x38) = in_RSI;
  *(long *)(*(long *)(in_RDI + 0x38) + 8) = *(long *)(*(long *)(in_RDI + 0x38) + 8) + 1;
  return;
}

Assistant:

void SetRoot(SQWeakRef *r)
    {
        __ObjRelease(_root);
        _root = r;
        __ObjAddRef(_root);
    }